

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_PackFontRangesGatherRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  float height;
  bool bVar1;
  bool bVar2;
  stbtt_pack_range *psVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int y1;
  int x1;
  int y0;
  int x0;
  stbtt_pack_range *local_68;
  int *local_60;
  ulong local_58;
  ulong local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar5 = 0;
  local_58 = (ulong)(uint)num_ranges;
  if (num_ranges < 1) {
    local_58 = uVar5;
  }
  local_60 = &rects->h;
  bVar1 = false;
  iVar6 = 0;
  local_68 = ranges;
  while (psVar3 = local_68, uVar5 != local_58) {
    height = local_68[uVar5].font_size;
    local_50 = uVar5;
    if (height <= 0.0) {
      uStack_44 = 0x80000000;
      uStack_40 = 0x80000000;
      uStack_3c = 0x80000000;
      local_48 = -height / (float)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                                          *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
    }
    else {
      local_48 = stbtt_ScaleForPixelHeight(info,height);
      uStack_44 = extraout_XMM0_Db;
      uStack_40 = extraout_XMM0_Dc;
      uStack_3c = extraout_XMM0_Dd;
    }
    psVar3[uVar5].h_oversample = (uchar)spc->h_oversample;
    psVar3[uVar5].v_oversample = (uchar)spc->v_oversample;
    piVar7 = local_60 + (long)iVar6 * 6;
    for (lVar8 = 0; lVar8 < psVar3[uVar5].num_chars; lVar8 = lVar8 + 1) {
      if (psVar3[uVar5].array_of_unicode_codepoints == (int *)0x0) {
        iVar4 = psVar3[uVar5].first_unicode_codepoint_in_range + (int)lVar8;
      }
      else {
        iVar4 = psVar3[uVar5].array_of_unicode_codepoints[lVar8];
      }
      iVar4 = stbtt_FindGlyphIndex(info,iVar4);
      bVar2 = bVar1;
      if ((iVar4 == 0) && (bVar2 = true, spc->skip_missing != 0 || bVar1)) {
        *(undefined8 *)(piVar7 + -1) = 0;
      }
      else {
        stbtt_GetGlyphBitmapBoxSubpixel
                  (info,iVar4,(float)spc->h_oversample * local_48,
                   (float)spc->v_oversample * local_48,0.0,0.0,&x0,&y0,&x1,&y1);
        iVar4 = spc->padding + -1;
        piVar7[-1] = ((x1 + iVar4) - x0) + spc->h_oversample;
        *piVar7 = ((iVar4 + y1) - y0) + spc->v_oversample;
        bVar1 = bVar2;
      }
      piVar7 = piVar7 + 6;
    }
    iVar6 = iVar6 + (int)lVar8;
    uVar5 = local_50 + 1;
  }
  return iVar6;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesGatherRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k;
   int missing_glyph_added = 0;

   k=0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      ranges[i].h_oversample = (unsigned char) spc->h_oversample;
      ranges[i].v_oversample = (unsigned char) spc->v_oversample;
      for (j=0; j < ranges[i].num_chars; ++j) {
         int x0,y0,x1,y1;
         int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
         int glyph = stbtt_FindGlyphIndex(info, codepoint);
         if (glyph == 0 && (spc->skip_missing || missing_glyph_added)) {
            rects[k].w = rects[k].h = 0;
         } else {
            stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,
                                            scale * spc->h_oversample,
                                            scale * spc->v_oversample,
                                            0,0,
                                            &x0,&y0,&x1,&y1);
            rects[k].w = (stbrp_coord) (x1-x0 + spc->padding + spc->h_oversample-1);
            rects[k].h = (stbrp_coord) (y1-y0 + spc->padding + spc->v_oversample-1);
            if (glyph == 0)
               missing_glyph_added = 1;
         }
         ++k;
      }
   }

   return k;
}